

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O3

void __thiscall
wigwag::detail::
listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::handler_node::handler_node
          (handler_node *this,
          intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *impl,handler_type *handler)

{
  intrusive_list_node *piVar1;
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *plVar2;
  undefined8 uVar3;
  
  (this->super_life_assurance)._lock_counter_and_alive_flag =
       (__atomic_base<unsigned_int>)0x80000000;
  (this->super_life_assurance)._ref_count = (__atomic_base<int>)0x2;
  piVar1 = &this->super_intrusive_list_node;
  (this->super_intrusive_list_node)._prev = piVar1;
  (this->super_intrusive_list_node)._next = piVar1;
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_release_token_impl_00214b60
  ;
  (this->super_life_assurance)._vptr_life_assurance = (_func_int **)&DAT_00214b90;
  (this->_listenable_impl)._raw = impl->_raw;
  impl->_raw = (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                *)0x0;
  *(undefined8 *)((long)&this->_handler + 0x10) = 0;
  *(undefined8 *)&this->_handler = 0;
  *(undefined8 *)((long)&this->_handler + 8) = 0;
  (this->_handler).obj._M_invoker = handler->_M_invoker;
  if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    *(undefined8 *)&this->_handler = *(undefined8 *)&(handler->super__Function_base)._M_functor;
    *(undefined8 *)((long)&this->_handler + 8) = uVar3;
    *(_Manager_type *)((long)&this->_handler + 0x10) = (handler->super__Function_base)._M_manager;
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
  }
  plVar2 = (this->_listenable_impl)._raw;
  (this->super_intrusive_list_node)._prev = (plVar2->_handlers)._root._prev;
  (this->super_intrusive_list_node)._next = &(plVar2->_handlers)._root;
  (plVar2->_handlers)._root._prev = piVar1;
  ((this->super_intrusive_list_node)._prev)->_next = piVar1;
  return;
}

Assistant:

handler_node(intrusive_ptr<listenable_impl> impl, handler_type handler)
                : _listenable_impl(std::move(impl)), _handler(std::move(handler))
            { _listenable_impl->get_handlers_container().push_back(*this); }